

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_array_stride_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t dim;
  uint32_t index;
  SPIRType basic_type;
  SPIRType SStack_178;
  
  SPIRType::SPIRType(&SStack_178,type);
  SStack_178.array.super_VectorView<unsigned_int>.buffer_size = 0;
  SStack_178.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  uVar2 = get_declared_type_size_msl(this,&SStack_178,is_packed,row_major);
  iVar1 = (int)(type->array).super_VectorView<unsigned_int>.buffer_size;
  if (iVar1 != 0) {
    for (index = 0; iVar1 - 1U != index; index = index + 1) {
      uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,index);
      uVar2 = uVar2 * (uVar3 + (uVar3 == 0));
    }
    SPIRType::~SPIRType(&SStack_178);
    return uVar2;
  }
  __assert_fail("dimensions > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                ,0x3ec7,
                "uint32_t spirv_cross::CompilerMSL::get_declared_type_array_stride_msl(const SPIRType &, bool, bool) const"
               );
}

Assistant:

uint32_t CompilerMSL::get_declared_type_array_stride_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Array stride in MSL is always size * array_size. sizeof(float3) == 16,
	// unlike GLSL and HLSL where array stride would be 16 and size 12.

	// We could use parent type here and recurse, but that makes creating physical type remappings
	// far more complicated. We'd rather just create the final type, and ignore having to create the entire type
	// hierarchy in order to compute this value, so make a temporary type on the stack.

	auto basic_type = type;
	basic_type.array.clear();
	basic_type.array_size_literal.clear();
	uint32_t value_size = get_declared_type_size_msl(basic_type, is_packed, row_major);

	uint32_t dimensions = uint32_t(type.array.size());
	assert(dimensions > 0);
	dimensions--;

	// Multiply together every dimension, except the last one.
	for (uint32_t dim = 0; dim < dimensions; dim++)
	{
		uint32_t array_size = to_array_size_literal(type, dim);
		value_size *= max<uint32_t>(array_size, 1u);
	}

	return value_size;
}